

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O2

bool DumpPeerAddresses(ArgsManager *args,AddrMan *addr)

{
  long lVar1;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  path src;
  path dest;
  bool bVar2;
  uint64_t uVar3;
  FILE *pFVar4;
  CChainParams *pCVar5;
  char *p2;
  bool bVar6;
  unsigned_short *in_R8;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  undefined1 in_stack_fffffffffffffde8 [16];
  pointer pbVar7;
  pointer pbVar8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var9;
  undefined6 uStack_1f0;
  uint16_t randv;
  AutoFile fileout;
  string local_1b8 [32];
  path local_198;
  path pathAddr;
  path local_148;
  path local_120;
  path pathTmp;
  string tmpfn;
  HashedSourceWriter<AutoFile> hashwriter;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirNet((path *)&local_198,args);
  fs::operator/(&pathAddr,(path *)&local_198,p2);
  std::filesystem::__cxx11::path::~path(&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"peers",(allocator<char> *)&stack0xfffffffffffffdf7);
  FastRandomContext::FastRandomContext((FastRandomContext *)&hashwriter,false);
  uVar3 = RandomMixin<FastRandomContext>::randbits<16>
                    ((RandomMixin<FastRandomContext> *)&hashwriter);
  ChaCha20::~ChaCha20((ChaCha20 *)(hashwriter.super_HashWriter.ctx.s + 4));
  randv = (uint16_t)uVar3;
  tinyformat::format<std::__cxx11::string,unsigned_short>
            (&tmpfn,(tinyformat *)"%s.%04x",(char *)local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&randv,in_R8);
  ArgsManager::GetDataDirNet((path *)&local_120,&gArgs);
  fs::u8path((path *)&hashwriter,&tmpfn);
  fs::operator/(&pathTmp,(path *)&local_120,(path *)&hashwriter);
  std::filesystem::__cxx11::path::~path((path *)&hashwriter);
  std::filesystem::__cxx11::path::~path(&local_120);
  pFVar4 = fsbridge::fopen((char *)&pathTmp,"wb");
  pbVar7 = (pointer)0x0;
  pbVar8 = (pointer)0x0;
  _Var9._M_head_impl = (_Impl *)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffffde8._0_8_;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffffde8._8_8_;
  AutoFile::AutoFile(&fileout,(FILE *)pFVar4,data_xor);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&stack0xfffffffffffffdf8);
  if (fileout.m_file == (FILE *)0x0) {
    AutoFile::fclose(&fileout,pFVar4);
    std::filesystem::remove((path *)&pathTmp);
    std::filesystem::__cxx11::path::string((string *)&hashwriter,&pathTmp.super_path);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
    ;
    source_file_00._M_len = 0x5a;
    logging_function_00._M_str = "SerializeFileDB";
    logging_function_00._M_len = 0xf;
    LogPrintFormatInternal<char[16],std::__cxx11::string>
              (logging_function_00,source_file_00,0x42,ALL,Error,(ConstevalFormatString<2U>)0xc8b7d6
               ,(char (*) [16])"SerializeFileDB",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hashwriter);
LAB_006a2b73:
    std::__cxx11::string::~string((string *)&hashwriter);
  }
  else {
    HashedSourceWriter<AutoFile>::HashedSourceWriter(&hashwriter,&fileout);
    pCVar5 = Params();
    Serialize<HashedSourceWriter<AutoFile>,_unsigned_char,_4UL>
              (&hashwriter,&pCVar5->pchMessageStart);
    AddrMan::Serialize<HashedSourceWriter<AutoFile>>(addr,&hashwriter);
    HashWriter::GetHash((uint256 *)&local_148,&hashwriter.super_HashWriter);
    pFVar4 = (FILE *)&fileout;
    base_blob<256U>::Serialize<AutoFile>((base_blob<256U> *)&local_148,(AutoFile *)pFVar4);
    bVar2 = AutoFile::Commit(&fileout);
    if (!bVar2) {
      AutoFile::fclose(&fileout,pFVar4);
      std::filesystem::remove((path *)&pathTmp);
      std::filesystem::__cxx11::path::string((string *)&hashwriter,&pathTmp.super_path);
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
      ;
      source_file_01._M_len = 0x5a;
      logging_function_01._M_str = "SerializeFileDB";
      logging_function_01._M_len = 0xf;
      LogPrintFormatInternal<char[16],std::__cxx11::string>
                (logging_function_01,source_file_01,0x4f,ALL,Error,
                 (ConstevalFormatString<2U>)0xc8b7f2,(char (*) [16])"SerializeFileDB",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hashwriter);
      goto LAB_006a2b73;
    }
    AutoFile::fclose(&fileout,pFVar4);
    std::filesystem::__cxx11::path::path((path *)&hashwriter,&pathTmp.super_path);
    std::filesystem::__cxx11::path::path(&local_148,&pathAddr.super_path);
    src.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)pbVar7;
    src.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffde8._0_8_;
    src.super_path._M_pathname._M_string_length = in_stack_fffffffffffffde8._8_8_;
    src.super_path._M_pathname.field_2._8_8_ = pbVar8;
    src.super_path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )_Var9._M_head_impl;
    dest.super_path._M_pathname._M_dataplus._M_p._6_2_ = randv;
    dest.super_path._M_pathname._M_dataplus._M_p._0_6_ = uStack_1f0;
    dest.super_path._M_pathname._M_string_length = (size_type)fileout.m_file;
    dest.super_path._16_24_ =
         fileout.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data;
    bVar2 = RenameOver(src,dest);
    std::filesystem::__cxx11::path::~path(&local_148);
    std::filesystem::__cxx11::path::~path((path *)&hashwriter);
    bVar6 = true;
    if (bVar2) goto LAB_006a2b82;
    std::filesystem::remove((path *)&pathTmp);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
    ;
    source_file._M_len = 0x5a;
    logging_function._M_str = "SerializeFileDB";
    logging_function._M_len = 0xf;
    LogPrintFormatInternal<char[16]>
              (logging_function,source_file,0x57,ALL,Error,(ConstevalFormatString<1U>)0xc8b80f,
               (char (*) [16])"SerializeFileDB");
  }
  bVar6 = false;
LAB_006a2b82:
  AutoFile::~AutoFile(&fileout);
  std::filesystem::__cxx11::path::~path(&pathTmp.super_path);
  std::__cxx11::string::~string((string *)&tmpfn);
  std::__cxx11::string::~string(local_1b8);
  std::filesystem::__cxx11::path::~path(&pathAddr.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool DumpPeerAddresses(const ArgsManager& args, const AddrMan& addr)
{
    const auto pathAddr = args.GetDataDirNet() / "peers.dat";
    return SerializeFileDB("peers", pathAddr, addr);
}